

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::resizeSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  InstanceDriver *vki;
  DeviceDriver *vkd;
  void **this;
  uint uVar1;
  BinaryCollection *binaryRegistry;
  VkDevice_s *device;
  VkResult VVar2;
  TestError *this_00;
  ulong uVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  size_t numCommandBuffers;
  ulong uVar7;
  deUint32 *pdVar8;
  deUint32 imageNdx;
  VkFence imageReadyFence;
  VkPipelineStageFlags waitDstStage;
  vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_> sizes;
  VkSemaphore imageReadySemaphore;
  UVec2 desiredSize;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_dd8;
  Move<vk::Handle<(vk::HandleType)26>_> swapchain;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_d38;
  Move<vk::Handle<(vk::HandleType)26>_> prevSwapchain;
  NativeObjects native;
  VkPresentInfoKHR presentInfo;
  _Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  local_c98;
  VkSurfaceCapabilitiesKHR capabilities;
  VkSubmitInfo submitInfo;
  VkSwapchainCreateInfoKHR swapchainInfo;
  DeviceHelper devHelper;
  TriangleRenderer renderer;
  InstanceHelper instHelper;
  SimpleAllocator allocator;
  
  desiredSize.m_data[0] = 0x100;
  desiredSize.m_data[1] = 0x100;
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,(VkAllocationCallbacks *)0x0);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::Maybe
            ((Maybe<tcu::Vector<unsigned_int,_2>_> *)&devHelper,&desiredSize);
  NativeObjects::NativeObjects
            (&native,context,&instHelper.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)&devHelper);
  vki = &instHelper.vki;
  pdVar8 = (deUint32 *)0x0;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper,&vki->super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             native.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.ptr,(VkAllocationCallbacks *)0x0);
  local_dd8.m_data.deleter.m_instance =
       (VkInstance)devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_dd8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_dd8.m_data.object.m_internal = (deUint64)devHelper.physicalDevice;
  local_dd8.m_data.deleter.m_instanceIface = (InstanceInterface *)devHelper._8_8_;
  devHelper.physicalDevice = (VkPhysicalDevice)0x0;
  devHelper.queueFamilyIndex = 0;
  devHelper._12_4_ = 0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&devHelper);
  DeviceHelper::DeviceHelper
            (&devHelper,context,&vki->super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_dd8.m_data.object.m_internal,(VkAllocationCallbacks *)0x0);
  ::vk::wsi::getPlatformProperties(wsiType);
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
            (&capabilities,&vki->super_InstanceInterface,devHelper.physicalDevice,
             (VkSurfaceKHR)local_dd8.m_data.object.m_internal);
  device = devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&submitInfo,&vki->super_InstanceInterface,
             devHelper.physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&allocator,&devHelper.vkd.super_DeviceInterface,device,
             (VkPhysicalDeviceMemoryProperties *)&submitInfo);
  std::vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::vector
            (&sizes,3,(allocator_type *)&submitInfo);
  tcu::operator/((tcu *)&submitInfo,&desiredSize,2);
  *(undefined8 *)
   (sizes.
    super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->m_data = submitInfo._0_8_;
  *&sizes.
    super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].m_data = desiredSize.m_data;
  tcu::operator*(2,&desiredSize);
  *(undefined8 *)
   sizes.
   super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>.
   _M_impl.super__Vector_impl_data._M_start[2].m_data = submitInfo._0_8_;
  for (uVar5 = 0; uVar3 = (ulong)uVar5,
      uVar3 < (ulong)((long)sizes.
                            super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)sizes.
                            super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    uVar1 = sizes.
            super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3].m_data[0];
    uVar6 = capabilities.maxImageExtent.width;
    if (uVar1 < capabilities.maxImageExtent.width) {
      uVar6 = uVar1;
    }
    if (uVar1 < capabilities.minImageExtent.width) {
      uVar6 = capabilities.minImageExtent.width;
    }
    uVar1 = sizes.
            super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3].m_data[1];
    sizes.
    super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar3].m_data[0] = uVar6;
    uVar6 = capabilities.maxImageExtent.height;
    if (uVar1 < capabilities.maxImageExtent.height) {
      uVar6 = uVar1;
    }
    if (uVar1 < capabilities.minImageExtent.height) {
      uVar6 = capabilities.minImageExtent.height;
    }
    sizes.
    super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar3].m_data[1] = uVar6;
  }
  prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal = 0;
  prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  uVar5 = 0;
  do {
    if ((ulong)((long)sizes.
                      super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sizes.
                      super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&submitInfo,"Resizing tests succeeded",(allocator<char> *)&renderer);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&submitInfo);
      std::__cxx11::string::~string((string *)&submitInfo);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase
                (&prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>);
      std::
      _Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::
      ~_Vector_base(&sizes.
                     super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                   );
      DeviceHelper::~DeviceHelper(&devHelper);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_dd8);
      NativeObjects::~NativeObjects(&native);
      InstanceHelper::~InstanceHelper(&instHelper);
      return __return_storage_ptr__;
    }
    getBasicSwapchainParameters
              (&swapchainInfo,wsiType,&instHelper.vki.super_InstanceInterface,
               devHelper.physicalDevice,(VkSurfaceKHR)local_dd8.m_data.object.m_internal,
               sizes.
               super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,(deUint32)pdVar8);
    swapchainInfo.oldSwapchain.m_internal =
         prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal;
    ::vk::createSwapchainKHR
              (&swapchain,&devHelper.vkd.super_DeviceInterface,device,&swapchainInfo,
               (VkAllocationCallbacks *)0x0);
    ::vk::wsi::getSwapchainImages
              (&swapchainImages,&devHelper.vkd.super_DeviceInterface,device,
               (VkSwapchainKHR)
               swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal);
    binaryRegistry = context->m_progCollection;
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *
           )&local_c98,&swapchainImages);
    submitInfo.sType = swapchainInfo.imageExtent.width;
    submitInfo._4_4_ = swapchainInfo.imageExtent.height;
    pdVar8 = (deUint32 *)(ulong)swapchainInfo.imageFormat;
    vkd = &devHelper.vkd;
    TriangleRenderer::TriangleRenderer
              (&renderer,&vkd->super_DeviceInterface,device,&allocator.super_Allocator,
               binaryRegistry,
               (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)&local_c98,swapchainInfo.imageFormat,(UVec2 *)&submitInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    ~_Vector_base(&local_c98);
    numCommandBuffers = 0;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,&vkd->super_DeviceInterface,
               device,2,devHelper.queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    local_d38.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
    local_d38.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
    local_d38.m_data.object.m_internal = submitInfo._0_8_;
    local_d38.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
    uVar3 = (long)swapchainImages.
                  super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)swapchainImages.
                  super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    createFences(&imageReadyFences,&vkd->super_DeviceInterface,device,uVar3);
    createSemaphores(&imageReadySemaphores,&vkd->super_DeviceInterface,device,uVar3 | 1);
    createSemaphores(&renderingCompleteSemaphores,&vkd->super_DeviceInterface,device,uVar3);
    allocateCommandBuffers
              (&commandBuffers,&vkd->super_DeviceInterface,device,
               (VkCommandPool)local_d38.m_data.object.m_internal,(VkCommandBufferLevel)uVar3,
               numCommandBuffers);
    for (uVar7 = 0; uVar7 != 0x3c; uVar7 = uVar7 + 1) {
      imageReadyFence.m_internal =
           ((imageReadyFences.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [uVar7 % (ulong)((long)imageReadyFences.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)imageReadyFences.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
           super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
      imageReadySemaphore.m_internal =
           ((imageReadySemaphores.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [uVar7 % (ulong)((long)imageReadySemaphores.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)imageReadySemaphores.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
           super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
      imageNdx = 0xffffffff;
      dVar4 = 1;
      if (uVar3 <= uVar7) {
        VVar2 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x16])
                          (&devHelper.vkd,device,1,&imageReadyFence,1,0xffffffffffffffff);
        ::vk::checkResult(VVar2,
                          "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x5f8);
      }
      VVar2 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x14])
                        (&devHelper.vkd,device,1,&imageReadyFence);
      ::vk::checkResult(VVar2,"vkd.resetFences(device, 1, &imageReadyFence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x5fa);
      pdVar8 = &imageNdx;
      VVar2 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x7b])
                        (&devHelper.vkd,device,
                         swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
                         m_internal,0xffffffffffffffff,imageReadySemaphore.m_internal,
                         imageReadyFence.m_internal);
      if (VVar2 == VK_SUBOPTIMAL_KHR) {
        submitInfo._0_8_ = context->m_testCtx->m_log;
        this = &submitInfo.pNext;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,"Got ");
        ::vk::operator<<((ostream *)this,VK_SUBOPTIMAL_KHR);
        std::operator<<((ostream *)this," at frame ");
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&submitInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      }
      else {
        ::vk::checkResult(VVar2,"acquireResult",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x607);
      }
      if ((ulong)((long)swapchainImages.
                        super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)swapchainImages.
                        super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)imageNdx) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                   ,0x60a);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      renderingCompleteSemaphore.m_internal =
           ((renderingCompleteSemaphores.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [uVar7 % (ulong)((long)renderingCompleteSemaphores.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)renderingCompleteSemaphores.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
           super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
      commandBuffer =
           ((commandBuffers.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [uVar7 % (ulong)((long)commandBuffers.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)commandBuffers.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
           super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
      submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
      submitInfo.pNext = (void *)0x0;
      waitDstStage = 0x400;
      submitInfo.waitSemaphoreCount = 1;
      submitInfo.pWaitSemaphores = &imageReadySemaphore;
      submitInfo.pWaitDstStageMask = &waitDstStage;
      submitInfo.pCommandBuffers = &commandBuffer;
      presentInfo.pWaitSemaphores = &renderingCompleteSemaphore;
      presentInfo.sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
      presentInfo.pNext = (void *)0x0;
      presentInfo.pSwapchains = (VkSwapchainKHR *)&swapchain;
      presentInfo.pImageIndices = &imageNdx;
      presentInfo.pResults = (VkResult *)0x0;
      presentInfo.waitSemaphoreCount = dVar4;
      presentInfo.swapchainCount = dVar4;
      submitInfo.commandBufferCount = dVar4;
      submitInfo.signalSemaphoreCount = dVar4;
      submitInfo.pSignalSemaphores = presentInfo.pWaitSemaphores;
      TriangleRenderer::recordFrame(&renderer,commandBuffer,imageNdx,(deUint32)uVar7);
      VVar2 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[2])
                        (&devHelper.vkd,devHelper.queue,1,&submitInfo,0);
      ::vk::checkResult(VVar2,"vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x629);
      VVar2 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x7c])
                        (&devHelper.vkd,devHelper.queue,&presentInfo);
      ::vk::checkResult(VVar2,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x62a);
    }
    VVar2 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[4])(&devHelper.vkd,device);
    ::vk::checkResult(VVar2,"vkd.deviceWaitIdle(device)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x62e);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::operator=(&prevSwapchain,&swapchain);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector(&commandBuffers);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector(&renderingCompleteSemaphores);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector(&imageReadySemaphores);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::~vector(&imageReadyFences);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_d38);
    TriangleRenderer::~TriangleRenderer(&renderer);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    ~_Vector_base(&swapchainImages.
                   super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 );
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase
              (&swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus resizeSwapchainTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize			(256, 256);
	const InstanceHelper			instHelper			(context, wsiType);
	const NativeObjects				native				(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface				(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper			(context, instHelper.vki, *instHelper.instance, *surface);
	const PlatformProperties&		platformProperties	= getPlatformProperties(wsiType);
	const VkSurfaceCapabilitiesKHR	capabilities		= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, devHelper.physicalDevice, *surface);
	const DeviceInterface&			vkd					= devHelper.vkd;
	const VkDevice					device				= *devHelper.device;
	SimpleAllocator					allocator			(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	vector<tcu::UVec2>				sizes				= getSwapchainSizeSequence(capabilities, desiredSize);
	Move<VkSwapchainKHR>			prevSwapchain;

	DE_ASSERT(platformProperties.swapchainExtent != PlatformProperties::SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE);
	DE_UNREF(platformProperties);

	for (deUint32 sizeNdx = 0; sizeNdx < sizes.size(); ++sizeNdx)
	{
		// \todo [2016-05-30 jesse] This test currently waits for idle and
		// recreates way more than necessary when recreating the swapchain. Make
		// it match expected real app behavior better by smoothly switching from
		// old to new swapchain. Once that is done, it will also be possible to
		// test creating a new swapchain while images from the previous one are
		// still acquired.

		VkSwapchainCreateInfoKHR		swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, sizes[sizeNdx], 2);
		swapchainInfo.oldSwapchain = *prevSwapchain;

		Move<VkSwapchainKHR>			swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
		const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);
		const TriangleRenderer			renderer					(vkd,
																	device,
																	allocator,
																	context.getBinaryCollection(),
																	swapchainImages,
																	swapchainInfo.imageFormat,
																	tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));
		const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));
		const size_t					maxQueuedFrames				= swapchainImages.size()*2;

		// We need to keep hold of fences from vkAcquireNextImageKHR to actually
		// limit number of frames we allow to be queued.
		const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

		// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
		// the semaphore in same time as the fence we use to meter rendering.
		const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

		// For rest we simply need maxQueuedFrames as we will wait for image
		// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
		// previous uses must have completed.
		const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
		const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

		try
		{
			const deUint32	numFramesToRender	= 60;

			for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
			{
				const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
				const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
				deUint32			imageNdx			= ~0u;

				if (frameNdx >= maxQueuedFrames)
					VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

				VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

				{
					const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																			  *swapchain,
																			  std::numeric_limits<deUint64>::max(),
																			  imageReadySemaphore,
																			  imageReadyFence,
																			  &imageNdx);

					if (acquireResult == VK_SUBOPTIMAL_KHR)
						context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
					else
						VK_CHECK(acquireResult);
				}

				TCU_CHECK((size_t)imageNdx < swapchainImages.size());

				{
					const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
					const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
					const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
					const VkSubmitInfo			submitInfo					=
					{
						VK_STRUCTURE_TYPE_SUBMIT_INFO,
						DE_NULL,
						1u,
						&imageReadySemaphore,
						&waitDstStage,
						1u,
						&commandBuffer,
						1u,
						&renderingCompleteSemaphore
					};
					const VkPresentInfoKHR		presentInfo					=
					{
						VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
						DE_NULL,
						1u,
						&renderingCompleteSemaphore,
						1u,
						&*swapchain,
						&imageNdx,
						(VkResult*)DE_NULL
					};

					renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
					VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
					VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
				}
			}

			VK_CHECK(vkd.deviceWaitIdle(device));

			prevSwapchain = swapchain;
		}
		catch (...)
		{
			// Make sure device is idle before destroying resources
			vkd.deviceWaitIdle(device);
			throw;
		}
	}

	return tcu::TestStatus::pass("Resizing tests succeeded");
}